

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double chi_square_cdf(double x,double a)

{
  double dVar1;
  double x2;
  double cdf;
  double c2;
  double b2;
  double a2;
  double a_local;
  double x_local;
  
  dVar1 = gamma_cdf(x * 0.5,0.0,1.0,a * 0.5);
  return dVar1;
}

Assistant:

double chi_square_cdf ( double x, double a )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_SQUARE_CDF evaluates the Chi squared CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the value of the random deviate.
//
//    Input, double A, the parameter of the distribution, usually
//    the number of degrees of freedom.
//
//    Output, double CDF, the value of the CDF.
//
{
  double a2;
  double b2;
  double c2;
  double cdf;
  double x2;

  x2 = 0.5 * x;
  a2 = 0.0;
  b2 = 1.0;
  c2 = 0.5 * a;

  cdf = gamma_cdf ( x2, a2, b2, c2 );

  return cdf;
}